

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLOutput.cpp
# Opt level: O3

void __thiscall Test::XMLOutput::XMLOutput(XMLOutput *this,string *outputFile)

{
  ostream *this_00;
  
  (this->super_CollectorOutput).suites.
  super__Vector_base<Test::CollectorOutput::SuiteInfo,_std::allocator<Test::CollectorOutput::SuiteInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_CollectorOutput).currentSuite = (SuiteInfo *)0x0;
  (this->super_CollectorOutput).suites.
  super__Vector_base<Test::CollectorOutput::SuiteInfo,_std::allocator<Test::CollectorOutput::SuiteInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_CollectorOutput).suites.
  super__Vector_base<Test::CollectorOutput::SuiteInfo,_std::allocator<Test::CollectorOutput::SuiteInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_CollectorOutput).currentMethod = (TestMethodInfo *)0x0;
  (this->super_CollectorOutput).super_Output._vptr_Output = (_func_int **)&PTR__XMLOutput_00133b68;
  this_00 = (ostream *)operator_new(0x200);
  std::ofstream::ofstream(this_00,(string *)outputFile,_S_out);
  (this->fileStream)._M_t.
  super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       this_00;
  this->output = this_00;
  std::__ostream_insert<char,std::char_traits<char>>
            (this_00,"<?xml version=\"1.0\" ?>\n<testsuites>\n",0x24);
  return;
}

Assistant:

XMLOutput::XMLOutput(const std::string &outputFile) : fileStream(new std::ofstream(outputFile)), output(*fileStream) {
  output << "<?xml version=\"1.0\" ?>\n<testsuites>\n";
}